

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comoment_suite.cpp
# Opt level: O1

void double_suite::run(void)

{
  test_empty();
  test_clear();
  test_same_no_increment();
  test_same_increment_by_one();
  test_same_increment_by_half();
  test_exponential_increase();
  return;
}

Assistant:

void run()
{
    test_empty();
    test_clear();
    test_same_no_increment();
    test_same_increment_by_one();
    test_same_increment_by_half();
    test_exponential_increase();
}